

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t icu_63::CollationBuilder::countTailoredNodes(int64_t *nodesArray,int32_t i,int32_t strength)

{
  bool bVar1;
  int32_t count;
  uint uVar2;
  uint uVar3;
  
  count = 0;
  do {
    if (i == 0) {
      return count;
    }
    uVar2 = (uint)nodesArray[i];
    uVar3 = uVar2 & 3;
    if ((int)uVar3 < strength) {
LAB_00240e69:
      bVar1 = false;
    }
    else {
      if (uVar3 == strength) {
        if ((nodesArray[i] & 8U) == 0) goto LAB_00240e69;
        count = count + 1;
      }
      i = uVar2 >> 8 & 0xfffff;
      bVar1 = true;
    }
    if (!bVar1) {
      return count;
    }
  } while( true );
}

Assistant:

int32_t
CollationBuilder::countTailoredNodes(const int64_t *nodesArray, int32_t i, int32_t strength) {
    int32_t count = 0;
    for(;;) {
        if(i == 0) { break; }
        int64_t node = nodesArray[i];
        if(strengthFromNode(node) < strength) { break; }
        if(strengthFromNode(node) == strength) {
            if(isTailoredNode(node)) {
                ++count;
            } else {
                break;
            }
        }
        i = nextIndexFromNode(node);
    }
    return count;
}